

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O2

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CBinopExpression::Copy(CBinopExpression *this)

{
  undefined1 uVar1;
  _func_int **pp_Var2;
  pointer *__ptr;
  long in_RSI;
  _func_int *local_28;
  _func_int *local_20;
  
  pp_Var2 = (_func_int **)operator_new(0x20);
  (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_28);
  (**(code **)(**(long **)(in_RSI + 0x10) + 0x18))(&local_20);
  uVar1 = *(undefined1 *)(in_RSI + 0x18);
  *pp_Var2 = (_func_int *)&PTR_Accept_0017b230;
  pp_Var2[1] = local_28;
  pp_Var2[2] = local_20;
  *(undefined1 *)(pp_Var2 + 3) = uVar1;
  (this->super_CExpression).super_IExpression.super_INode._vptr_INode = pp_Var2;
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CBinopExpression::Copy( ) const {
    return std::move( std::unique_ptr<const IRT::CExpression>(
            new CBinopExpression( leftOperand->Copy( ), rightOperand->Copy( ), operation )));
}